

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

RTPRawPacket * __thiscall jrtplib::RTPTCPTransmitter::GetNextPacket(RTPTCPTransmitter *this)

{
  _List_node_base *p_Var1;
  RTPRawPacket *pRVar2;
  
  if ((this->m_init == true) && (this->m_created == true)) {
    p_Var1 = (this->m_rawpacketlist).
             super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)&this->m_rawpacketlist) {
      pRVar2 = (RTPRawPacket *)p_Var1[1]._M_next;
      std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
      pop_front(&this->m_rawpacketlist);
      return pRVar2;
    }
  }
  return (RTPRawPacket *)0x0;
}

Assistant:

RTPRawPacket *RTPTCPTransmitter::GetNextPacket()
{
	if (!m_init)
		return 0;
	
	MAINMUTEX_LOCK
	
	RTPRawPacket *p;
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return 0;
	}
	if (m_rawpacketlist.empty())
	{
		MAINMUTEX_UNLOCK
		return 0;
	}

	p = *(m_rawpacketlist.begin());
	m_rawpacketlist.pop_front();

	MAINMUTEX_UNLOCK
	return p;
}